

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O3

char * JlStrDup(char *SourceString)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  if (SourceString != (char *)0x0) {
    sVar1 = strlen(SourceString);
    __dest = WjTestLib_Calloc(sVar1 + 1,1);
    if (__dest != (void *)0x0) {
      pcVar2 = (char *)memcpy(__dest,SourceString,sVar1 + 1);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char*
    JlStrDup
    (
        char const*     SourceString
    )
{
    char* newString = NULL;

    if( NULL != SourceString )
    {
        size_t stringSize = strlen( SourceString ) + 1;
        newString = JlAlloc( stringSize );
        if( NULL != newString )
        {
            memcpy( newString, SourceString, stringSize );
        }
    }

    return newString;
}